

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# J2CLItableMerging.cpp
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::anon_unknown_153::J2CLItableMerging::rerouteItableAccess::Rerouter::create(Rerouter *this)

{
  undefined1 local_20 [16];
  Rerouter *this_local;
  
  this_local = this;
  std::
  make_unique<wasm::(anonymous_namespace)::J2CLItableMerging::rerouteItableAccess(wasm::Module&)::Rerouter,wasm::(anonymous_namespace)::J2CLItableMerging&>
            ((J2CLItableMerging *)local_20);
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::(anonymous_namespace)::J2CLItableMerging::rerouteItableAccess(wasm::Module&)::Rerouter,std::default_delete<wasm::(anonymous_namespace)::J2CLItableMerging::rerouteItableAccess(wasm::Module&)::Rerouter>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this,
             (unique_ptr<Rerouter,_std::default_delete<Rerouter>_> *)local_20);
  std::unique_ptr<Rerouter,_std::default_delete<Rerouter>_>::~unique_ptr
            ((unique_ptr<Rerouter,_std::default_delete<Rerouter>_> *)local_20);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
        return std::make_unique<Rerouter>(parent);
      }